

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O3

void __thiscall llvm::detail::DoubleAPFloat::DoubleAPFloat(DoubleAPFloat *this,DoubleAPFloat *RHS)

{
  Storage *rhs;
  undefined8 *puVar1;
  fltSemantics *pfVar2;
  APFloat *pAVar3;
  
  pfVar2 = RHS->Semantics;
  this->Semantics = pfVar2;
  pAVar3 = (RHS->Floats)._M_t.
           super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t.
           super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
           super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl;
  if (pAVar3 == (APFloat *)0x0) {
    pAVar3 = (APFloat *)0x0;
  }
  else {
    puVar1 = (undefined8 *)operator_new__(0x48);
    *puVar1 = 2;
    if ((pAVar3->U).semantics == (fltSemantics *)semPPCDoubleDouble) {
      DoubleAPFloat((DoubleAPFloat *)(puVar1 + 2),(DoubleAPFloat *)&(pAVar3->U).IEEE);
    }
    else {
      IEEEFloat::IEEEFloat((IEEEFloat *)(puVar1 + 2),&(pAVar3->U).IEEE);
    }
    pAVar3 = (RHS->Floats)._M_t.
             super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t.
             super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
             super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl;
    rhs = &pAVar3[1].U;
    if (pAVar3[1].U.semantics == (fltSemantics *)semPPCDoubleDouble) {
      DoubleAPFloat((DoubleAPFloat *)(puVar1 + 6),(DoubleAPFloat *)&rhs->IEEE);
    }
    else {
      IEEEFloat::IEEEFloat((IEEEFloat *)(puVar1 + 6),&rhs->IEEE);
    }
    pAVar3 = (APFloat *)(puVar1 + 1);
    pfVar2 = this->Semantics;
  }
  (this->Floats)._M_t.super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>.
  _M_t.super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
  super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl = pAVar3;
  if (pfVar2 == (fltSemantics *)semPPCDoubleDouble) {
    return;
  }
  __assert_fail("Semantics == &semPPCDoubleDouble",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                ,0xf32,"llvm::detail::DoubleAPFloat::DoubleAPFloat(const DoubleAPFloat &)");
}

Assistant:

DoubleAPFloat::DoubleAPFloat(const DoubleAPFloat &RHS)
    : Semantics(RHS.Semantics),
      Floats(RHS.Floats ? new APFloat[2]{APFloat(RHS.Floats[0]),
                                         APFloat(RHS.Floats[1])}
                        : nullptr) {
  assert(Semantics == &semPPCDoubleDouble);
}